

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneNamesImpl::loadAllDisplayNames(TimeZoneNamesImpl *this,UErrorCode *status)

{
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63((UMutex *)gDataMutex);
    internalLoadAllDisplayNames(this,status);
    umtx_unlock_63((UMutex *)gDataMutex);
  }
  return;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }